

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O2

void __thiscall OpenMD::Rattle::doConstraint(Rattle *this,ConstraintPairFuncPtr func)

{
  pointer ppCVar1;
  pointer ppCVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  Molecule *pMVar6;
  code *pcVar7;
  int iVar8;
  pointer ppCVar9;
  pointer ppCVar10;
  long in_RDX;
  ConstraintPair *pCVar11;
  long *plVar12;
  ConstraintElem *pCVar13;
  MoleculeIterator mi;
  
  if (this->doRattle_ == true) {
    mi._M_node = (_Base_ptr)0x0;
    pMVar6 = SimInfo::beginMolecule(this->info_,&mi);
    while (pMVar6 != (Molecule *)0x0) {
      ppCVar10 = (pMVar6->constraintElems_).
                 super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar1 = (pMVar6->constraintElems_).
                super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar10 != ppCVar1) goto LAB_001e3d2f;
      pCVar13 = (ConstraintElem *)0x0;
      while (pCVar13 != (ConstraintElem *)0x0) {
        ((pCVar13->moved_).
         super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data_
             = true;
        ((pCVar13->moving_).
         super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data_
             = false;
        ppCVar10 = ppCVar10 + 1;
        pCVar13 = (ConstraintElem *)0x0;
        if (ppCVar10 != ppCVar1) {
LAB_001e3d2f:
          pCVar13 = *ppCVar10;
        }
      }
      ppCVar9 = (pMVar6->constraintPairs_).
                super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar2 = (pMVar6->constraintPairs_).
                super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar9 != ppCVar2) goto LAB_001e3d61;
      pCVar11 = (ConstraintPair *)0x0;
      while (pCVar11 != (ConstraintPair *)0x0) {
        pCVar11->force_ = 0.0;
        ppCVar9 = ppCVar9 + 1;
        pCVar11 = (ConstraintPair *)0x0;
        if (ppCVar9 != ppCVar2) {
LAB_001e3d61:
          pCVar11 = *ppCVar9;
        }
      }
      pMVar6 = SimInfo::nextMolecule(this->info_,&mi);
    }
    plVar12 = (long *)((long)&this->info_ + in_RDX);
    bVar4 = false;
    iVar8 = 0;
    while( true ) {
      if ((bVar4) || (this->maxConsIteration_ <= iVar8)) break;
      pMVar6 = SimInfo::beginMolecule(this->info_,&mi);
      bVar4 = true;
      while (pMVar6 != (Molecule *)0x0) {
        ppCVar9 = (pMVar6->constraintPairs_).
                  super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (ppCVar9 !=
            (pMVar6->constraintPairs_).
            super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_001e3edc;
        pCVar11 = (ConstraintPair *)0x0;
        while (pCVar11 != (ConstraintPair *)0x0) {
          if ((((pCVar11->consElem1_->moved_).
                super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->data_ != false) ||
             (((pCVar11->consElem2_->moved_).
               super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->data_ == true)) {
            pcVar7 = (code *)func;
            if ((func & 1) != 0) {
              pcVar7 = *(code **)(*plVar12 + -1 + func);
            }
            iVar5 = (*pcVar7)(plVar12,pCVar11);
            if (iVar5 != 1) {
              if (iVar5 == 0) {
                ((pCVar11->consElem1_->moving_).
                 super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->data_ = true;
                ((pCVar11->consElem2_->moving_).
                 super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->data_ = true;
                bVar4 = false;
              }
              else {
                if (iVar5 == -1) {
                  builtin_strncpy(painCave.errMsg + 0x33,"t Fail\n",8);
                  builtin_strncpy(painCave.errMsg + 0x20,"nstrainA, Constrain",0x13);
                  builtin_strncpy(painCave.errMsg + 0x10,"re in Rattle::co",0x10);
                  painCave.errMsg[8] = 'n';
                  painCave.errMsg[9] = 't';
                  painCave.errMsg[10] = ' ';
                  painCave.errMsg[0xb] = 'f';
                  painCave.errMsg[0xc] = 'a';
                  painCave.errMsg[0xd] = 'i';
                  painCave.errMsg[0xe] = 'l';
                  painCave.errMsg[0xf] = 'u';
                }
                else {
                  builtin_strncpy(painCave.errMsg + 0x33,"ized status",0xc);
                  builtin_strncpy(painCave.errMsg + 0x20,"t() Error: unrecogn",0x13);
                  builtin_strncpy(painCave.errMsg + 0x10,"thm::doConstrain",0x10);
                  painCave.errMsg[8] = 'n';
                  painCave.errMsg[9] = 't';
                  painCave.errMsg[10] = 'A';
                  painCave.errMsg[0xb] = 'l';
                  painCave.errMsg[0xc] = 'g';
                  painCave.errMsg[0xd] = 'o';
                  painCave.errMsg[0xe] = 'r';
                  painCave.errMsg[0xf] = 'i';
                }
                builtin_strncpy(painCave.errMsg,"Constrai",8);
                painCave.isFatal = 1;
                simError();
              }
            }
          }
          ppCVar9 = ppCVar9 + 1;
          pCVar11 = (ConstraintPair *)0x0;
          if (ppCVar9 !=
              (pMVar6->constraintPairs_).
              super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001e3edc:
            pCVar11 = *ppCVar9;
          }
        }
        pMVar6 = SimInfo::nextMolecule(this->info_,&mi);
      }
      errorCheckPoint();
      pMVar6 = SimInfo::beginMolecule(this->info_,&mi);
      while (pMVar6 != (Molecule *)0x0) {
        ppCVar10 = (pMVar6->constraintElems_).
                   super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppCVar1 = (pMVar6->constraintElems_).
                  super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppCVar10 != ppCVar1) goto LAB_001e3f57;
        pCVar13 = (ConstraintElem *)0x0;
        while (pCVar13 != (ConstraintElem *)0x0) {
          peVar3 = (pCVar13->moving_).
                   super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          ((pCVar13->moved_).
           super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          data_ = peVar3->data_;
          peVar3->data_ = false;
          ppCVar10 = ppCVar10 + 1;
          pCVar13 = (ConstraintElem *)0x0;
          if (ppCVar10 != ppCVar1) {
LAB_001e3f57:
            pCVar13 = *ppCVar10;
          }
        }
        pMVar6 = SimInfo::nextMolecule(this->info_,&mi);
      }
      iVar8 = iVar8 + 1;
    }
    if (!bVar4) {
      snprintf(painCave.errMsg,2000,
               "Constraint failure in Rattle::constrainA, too many iterations: %d\n");
      painCave.isFatal = 1;
      simError();
    }
    errorCheckPoint();
  }
  return;
}

Assistant:

void Rattle::doConstraint(ConstraintPairFuncPtr func) {
    if (!doRattle_) return;

    Molecule* mol;
    SimInfo::MoleculeIterator mi;
    ConstraintElem* consElem;
    Molecule::ConstraintElemIterator cei;
    ConstraintPair* consPair;
    Molecule::ConstraintPairIterator cpi;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (consElem = mol->beginConstraintElem(cei); consElem != NULL;
           consElem = mol->nextConstraintElem(cei)) {
        consElem->setMoved(true);
        consElem->setMoving(false);
      }
      for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
           consPair = mol->nextConstraintPair(cpi)) {
        consPair->resetConstraintForce();
      }
    }

    // main loop of constraint algorithm
    int done      = 0;
    int iteration = 0;
    while (!done && iteration < maxConsIteration_) {
      done = 1;

      // loop over every constraint pair

      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
             consPair = mol->nextConstraintPair(cpi)) {
          // dispatch constraint algorithm
          if (consPair->isMoved()) {
            int exeStatus = (this->*func)(consPair);

            switch (exeStatus) {
            case consFail:
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "Constraint failure in Rattle::constrainA, "
                       "Constraint Fail\n");
              painCave.isFatal = 1;
              simError();

              break;
            case consSuccess:
              // constrain the pair by moving two elements
              done = 0;
              consPair->getConsElem1()->setMoving(true);
              consPair->getConsElem2()->setMoving(true);
              break;
            case consAlready:
              // current pair is already constrained, do not need to
              // move the elements
              break;
            default:
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "ConstraintAlgorithm::doConstraint() "
                       "Error: unrecognized status");
              painCave.isFatal = 1;
              simError();
              break;
            }
          }
        }
      }  // end for(iter->first())

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &done, 1, MPI_INT, MPI_LAND, MPI_COMM_WORLD);
#endif

      errorCheckPoint();

      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (consElem = mol->beginConstraintElem(cei); consElem != NULL;
             consElem = mol->nextConstraintElem(cei)) {
          consElem->setMoved(consElem->getMoving());
          consElem->setMoving(false);
        }
      }
      iteration++;
    }  // end while

    if (!done) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Constraint failure in Rattle::constrainA, "
               "too many iterations: %d\n",
               iteration);
      painCave.isFatal = 1;
      simError();
    }

    errorCheckPoint();
  }